

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_array.c
# Opt level: O0

ares_array_t * ares_array_create(size_t member_size,ares_array_destructor_t destruct)

{
  ares_array_t *arr;
  ares_array_destructor_t destruct_local;
  size_t member_size_local;
  
  if (member_size == 0) {
    member_size_local = 0;
  }
  else {
    member_size_local = (size_t)ares_malloc_zero(0x30);
    if ((undefined8 *)member_size_local == (undefined8 *)0x0) {
      member_size_local = 0;
    }
    else {
      *(size_t *)(member_size_local + 0x10) = member_size;
      *(ares_array_destructor_t *)member_size_local = destruct;
    }
  }
  return (ares_array_t *)member_size_local;
}

Assistant:

ares_array_t *ares_array_create(size_t                  member_size,
                                ares_array_destructor_t destruct)
{
  ares_array_t *arr;

  if (member_size == 0) {
    return NULL;
  }

  arr = ares_malloc_zero(sizeof(*arr));
  if (arr == NULL) {
    return NULL;
  }

  arr->member_size = member_size;
  arr->destruct    = destruct;
  return arr;
}